

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdatasrc.h
# Opt level: O0

int __thiscall CVmResFileSource::seek(CVmResFileSource *this,long ofs,int mode)

{
  long lVar1;
  int in_EDX;
  ulong in_RSI;
  long *in_RDI;
  ulong local_18;
  int local_4;
  
  local_18 = in_RSI;
  if (in_EDX != 0) {
    if (in_EDX == 1) {
      lVar1 = (**(code **)(*in_RDI + 0x38))();
      local_18 = lVar1 + in_RSI;
    }
    else {
      if (in_EDX != 2) {
        return 1;
      }
      local_18 = (in_RDI[3] - in_RDI[2]) + in_RSI;
    }
  }
  if (((long)local_18 < 0) || ((ulong)(in_RDI[3] - in_RDI[2]) < local_18)) {
    local_4 = 1;
  }
  else {
    local_4 = fseek((FILE *)in_RDI[1],in_RDI[2] + local_18,0);
  }
  return local_4;
}

Assistant:

virtual int seek(long ofs, int mode)
    {
        switch (mode)
        {
        case OSFSK_SET:
        do_set:
            /* check that 'ofs' is in range */
            if (ofs < 0 || (unsigned long)ofs > end - start)
                return 1;

            /* seek to the offset */
            return osfseek(fp, start + ofs, OSFSK_SET);

        case OSFSK_CUR:
            /* set the offset relative to the current position */
            ofs += get_pos();
            goto do_set;

        case OSFSK_END:
            /* set the offset relative to the end of the file */
            ofs += (end - start);
            goto do_set;

        default:
            /* invalid mode */
            return 1;
        }
    }